

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_delta_decoder.h
# Opt level: O2

bool __thiscall
draco::PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
ComputeOriginalValues
          (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
           *this,CorrType *in_corr,int *out_data,int size,int num_components,PointIndex *param_5)

{
  __uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true> predicted_vals;
  long lVar1;
  long lVar2;
  ulong __n;
  int *out_original_vals;
  Transform *this_00;
  CorrType *corr_vals;
  unique_ptr<int[],_std::default_delete<int[]>_> zero_vals;
  
  this_00 = &(this->
             super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
             ).transform_;
  PredictionSchemeWrapTransformBase<int>::Init
            (&this_00->super_PredictionSchemeWrapTransformBase<int>,num_components);
  lVar1 = (long)num_components;
  __n = 0xffffffffffffffff;
  if (-1 < num_components) {
    __n = lVar1 * 4;
  }
  predicted_vals.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)operator_new__(__n);
  memset((void *)predicted_vals.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl,0,__n);
  zero_vals._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 predicted_vals.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
  PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
            (this_00,(int *)predicted_vals.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                            _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl,in_corr,out_data);
  out_original_vals = out_data + lVar1;
  corr_vals = in_corr + lVar1;
  for (lVar2 = lVar1; lVar2 < size; lVar2 = lVar2 + lVar1) {
    PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
              (this_00,out_data,corr_vals,out_original_vals);
    out_original_vals = out_original_vals + lVar1;
    out_data = out_data + lVar1;
    corr_vals = corr_vals + lVar1;
  }
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&zero_vals);
  return true;
}

Assistant:

bool PredictionSchemeDeltaDecoder<DataTypeT, TransformT>::ComputeOriginalValues(
    const CorrType *in_corr, DataTypeT *out_data, int size, int num_components,
    const PointIndex *) {
  this->transform().Init(num_components);
  // Decode the original value for the first element.
  std::unique_ptr<DataTypeT[]> zero_vals(new DataTypeT[num_components]());
  this->transform().ComputeOriginalValue(zero_vals.get(), in_corr, out_data);

  // Decode data from the front using D(i) = D(i) + D(i - 1).
  for (int i = num_components; i < size; i += num_components) {
    this->transform().ComputeOriginalValue(out_data + i - num_components,
                                           in_corr + i, out_data + i);
  }
  return true;
}